

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  ulong uVar1;
  int n;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (count == 1) {
    if (0.0 <= items->Width) {
      fVar4 = items->Width - width_excess;
      if (fVar4 <= 1.0) {
        fVar4 = 1.0;
      }
      items->Width = fVar4;
    }
  }
  else {
    ImQsort(items,(long)count,8,ShrinkWidthItemComparer);
    uVar1 = 1;
    for (; ((int)uVar1 < count && (0.0 < width_excess)); width_excess = width_excess - fVar5 * fVar6
        ) {
      for (uVar1 = (ulong)(int)uVar1; (long)uVar1 < (long)count; uVar1 = uVar1 + 1) {
        fVar4 = items->Width;
        fVar5 = items[uVar1].Width;
        if (fVar5 < fVar4) {
          if (fVar5 < 0.0) goto LAB_001852e3;
          fVar4 = fVar4 - fVar5;
          goto LAB_001852ed;
        }
      }
      fVar4 = items->Width;
LAB_001852e3:
      fVar4 = fVar4 + -1.0;
LAB_001852ed:
      if (fVar4 <= 0.0) break;
      fVar6 = (float)(int)uVar1;
      fVar5 = width_excess / fVar6;
      if (fVar4 <= fVar5) {
        fVar5 = fVar4;
      }
      uVar2 = 0;
      if (0 < (int)uVar1) {
        uVar2 = uVar1 & 0xffffffff;
      }
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        items[uVar3].Width = items[uVar3].Width - fVar5;
      }
    }
    uVar2 = 0;
    uVar1 = (ulong)(uint)count;
    if (count < 1) {
      uVar1 = uVar2;
    }
    fVar4 = 0.0;
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      fVar5 = (float)(int)items[uVar2].Width;
      fVar4 = fVar4 + (items[uVar2].Width - fVar5);
      items[uVar2].Width = fVar5;
    }
    if (0.0 < fVar4) {
      for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        if (items[uVar2].Index < (int)(fVar4 + 0.01)) {
          items[uVar2].Width = items[uVar2].Width + 1.0;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}